

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

void __thiscall absl::lts_20240722::Hex::Hex(Hex *this,PadSpec spec,uint64_t v)

{
  PadSpec PVar1;
  char local_39;
  uint64_t v_local;
  PadSpec spec_local;
  Hex *this_local;
  
  this->value = v;
  if (spec == kNoPad) {
    PVar1 = kNoPad;
  }
  else {
    PVar1 = spec;
    if (0x41 < spec) {
      PVar1 = spec - 0x40;
    }
  }
  this->width = PVar1;
  local_39 = ' ';
  if (spec < kSpacePad2) {
    local_39 = '0';
  }
  this->fill = local_39;
  return;
}

Assistant:

Hex(PadSpec spec, uint64_t v)
      : value(v),
        width(spec == absl::kNoPad
                  ? 1
                  : spec >= absl::kSpacePad2 ? spec - absl::kSpacePad2 + 2
                                             : spec - absl::kZeroPad2 + 2),
        fill(spec >= absl::kSpacePad2 ? ' ' : '0') {}